

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::SetCurrentLinkType(cmComputeLinkInformation *this,LinkType lt)

{
  ItemIsPath local_1c [2];
  LinkType local_14;
  cmComputeLinkInformation *pcStack_10;
  LinkType lt_local;
  cmComputeLinkInformation *this_local;
  
  if ((this->CurrentLinkType != lt) &&
     (this->CurrentLinkType = lt, (this->LinkTypeEnabled & 1U) != 0)) {
    local_14 = lt;
    pcStack_10 = this;
    if (this->CurrentLinkType == LinkStatic) {
      local_1c[1] = 0;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string&,cmComputeLinkInformation::ItemIsPath>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&this->StaticLinkTypeFlag,local_1c + 1);
    }
    else if (this->CurrentLinkType == LinkShared) {
      local_1c[0] = No;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string&,cmComputeLinkInformation::ItemIsPath>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&this->SharedLinkTypeFlag,local_1c);
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::SetCurrentLinkType(LinkType lt)
{
  // If we are changing the current link type add the flag to tell the
  // linker about it.
  if (this->CurrentLinkType != lt) {
    this->CurrentLinkType = lt;

    if (this->LinkTypeEnabled) {
      switch (this->CurrentLinkType) {
        case LinkStatic:
          this->Items.emplace_back(this->StaticLinkTypeFlag, ItemIsPath::No);
          break;
        case LinkShared:
          this->Items.emplace_back(this->SharedLinkTypeFlag, ItemIsPath::No);
          break;
        default:
          break;
      }
    }
  }
}